

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::detail::MessageBuilder::MessageBuilder
          (MessageBuilder *this,char *file,int line,Enum severity)

{
  ostream *poVar1;
  Enum severity_local;
  int line_local;
  char *file_local;
  MessageBuilder *this_local;
  
  MessageData::MessageData(&this->super_MessageData);
  this->logged = false;
  poVar1 = tlssPush();
  this->m_stream = poVar1;
  (this->super_MessageData).m_file = file;
  (this->super_MessageData).m_line = line;
  (this->super_MessageData).m_severity = severity;
  return;
}

Assistant:

MessageBuilder::MessageBuilder(const char* file, int line, assertType::Enum severity) {
        m_stream   = tlssPush();
        m_file     = file;
        m_line     = line;
        m_severity = severity;
    }